

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

iterator __thiscall
efsw::DirectorySnapshot::nodeInFiles_abi_cxx11_(DirectorySnapshot *this,FileInfo *fi)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  bVar1 = FileInfo::inodeSupported();
  if (bVar1) {
    for (p_Var2 = (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->Files)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      bVar1 = FileInfo::sameInode((FileInfo *)(p_Var2 + 2),fi);
      if ((bVar1) &&
         (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var2 + 2),&fi->Filepath), bVar1)) {
        return (iterator)p_Var2;
      }
    }
  }
  return (iterator)&(this->Files)._M_t._M_impl.super__Rb_tree_header._M_header;
}

Assistant:

FileInfoMap::iterator DirectorySnapshot::nodeInFiles( FileInfo& fi ) {
	FileInfoMap::iterator it;

	if ( FileInfo::inodeSupported() ) {
		for ( it = Files.begin(); it != Files.end(); it++ ) {
			if ( it->second.sameInode( fi ) && it->second.Filepath != fi.Filepath ) {
				return it;
			}
		}
	}

	return Files.end();
}